

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_fdset(CURLM *multi_handle,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  uint uVar1;
  CURLMcode CVar2;
  uint uVar3;
  fd_set *pfVar4;
  fd_set *pfVar5;
  uint uVar6;
  uint uVar7;
  Curl_multi *multi;
  SessionHandle *data;
  bool bVar8;
  curl_socket_t sockbunch [5];
  uint local_48 [6];
  
  CVar2 = CURLM_BAD_HANDLE;
  if ((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) {
    data = *(SessionHandle **)((long)multi_handle + 8);
    if (data == (SessionHandle *)0x0) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = 0xffffffff;
      pfVar5 = write_fd_set;
      do {
        uVar1 = multi_getsock(data,(curl_socket_t *)local_48,(int)pfVar5);
        pfVar4 = (fd_set *)0x0;
        do {
          uVar7 = 0xffffffff;
          if (((uVar1 >> ((uint)pfVar4 & 0x1f) & 1) != 0) &&
             (uVar3 = local_48[(long)pfVar4], uVar3 < 0x400)) {
            read_fd_set->__fds_bits[uVar3 >> 6] =
                 read_fd_set->__fds_bits[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
            uVar7 = uVar3;
          }
          if ((((uVar1 >> ((byte)pfVar4 & 0x1f)) >> 0x10 & 1) != 0) &&
             (uVar3 = local_48[(long)pfVar4], uVar3 < 0x400)) {
            write_fd_set->__fds_bits[uVar3 >> 6] =
                 write_fd_set->__fds_bits[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
            uVar7 = uVar3;
          }
          uVar3 = uVar6;
          if ((int)uVar6 < (int)uVar7) {
            uVar3 = uVar7;
          }
          pfVar5 = pfVar4;
        } while ((uVar7 != 0xffffffff) &&
                (pfVar5 = (fd_set *)((long)pfVar4->__fds_bits + 1), bVar8 = pfVar4 < (fd_set *)0x4,
                pfVar4 = pfVar5, uVar6 = uVar3, bVar8));
        data = data->next;
      } while (data != (SessionHandle *)0x0);
    }
    *max_fd = uVar6;
    CVar2 = CURLM_OK;
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_fdset(CURLM *multi_handle,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  int this_max_fd=-1;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if((bitmap & GETSOCK_READSOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], read_fd_set);
        s = sockbunch[i];
      }
      if((bitmap & GETSOCK_WRITESOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], write_fd_set);
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD)
        /* this socket is unused, break out of loop */
        break;
      else {
        if((int)s > this_max_fd)
          this_max_fd = (int)s;
      }
    }

    data = data->next; /* check next handle */
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}